

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O1

void sqlite3AlterFinishAddColumn(Parse *pParse,Token *pColDef)

{
  sqlite3 *db;
  Table *pTVar1;
  char *pcVar2;
  Column *pCVar3;
  Expr *pEVar4;
  int iVar5;
  long lVar6;
  Table *pTab;
  byte *__dest;
  uint uVar7;
  char *pcVar8;
  Schema **ppSVar9;
  Expr *pExpr;
  char *pcVar10;
  byte *pbVar11;
  int iDb;
  ulong uVar12;
  sqlite3_value *pVal;
  
  if ((pParse->nErr == 0) && (db = pParse->db, db->mallocFailed == '\0')) {
    pTVar1 = pParse->pNewTable;
    if (pTVar1->pSchema == (Schema *)0x0) {
      uVar12 = 0xfff0bdc0;
    }
    else {
      uVar7 = db->nDb;
      if ((int)uVar7 < 1) {
        uVar12 = 0;
      }
      else {
        ppSVar9 = &db->aDb->pSchema;
        uVar12 = 0;
        do {
          if (*ppSVar9 == pTVar1->pSchema) goto LAB_001841e2;
          uVar12 = uVar12 + 1;
          ppSVar9 = ppSVar9 + 4;
        } while (uVar7 != uVar12);
        uVar12 = (ulong)uVar7;
      }
    }
LAB_001841e2:
    iDb = (int)uVar12;
    pcVar10 = db->aDb[iDb].zName;
    pcVar2 = pTVar1->zName;
    pCVar3 = pTVar1->aCol;
    lVar6 = (long)pTVar1->nCol;
    pEVar4 = pCVar3[lVar6 + -1].pDflt;
    pTab = sqlite3FindTable(db,pcVar2 + 0x10,pcVar10);
    iVar5 = sqlite3AuthCheck(pParse,0x1a,pcVar10,pTab->zName,(char *)0x0);
    if (iVar5 == 0) {
      pExpr = (Expr *)0x0;
      if ((pEVar4 != (Expr *)0x0) && (pEVar4->op != 'b')) {
        pExpr = pEVar4;
      }
      if ((pCVar3[lVar6 + -1].colFlags & 1) == 0) {
        if (pTVar1->pIndex == (Index *)0x0) {
          if ((((db->flags & 0x40000) == 0) || (pTVar1->pFKey == (FKey *)0x0)) ||
             (pExpr == (Expr *)0x0)) {
            if ((pCVar3[lVar6 + -1].notNull == '\0') || (pExpr != (Expr *)0x0)) {
              if (pExpr != (Expr *)0x0) {
                iVar5 = sqlite3ValueFromExpr(db,pExpr,'\x01','b',&pVal);
                if (iVar5 != 0) {
                  db->mallocFailed = '\x01';
                  return;
                }
                if (pVal == (sqlite3_value *)0x0) {
                  sqlite3ErrorMsg(pParse,"Cannot add a column with non-constant default");
                  return;
                }
                sqlite3ValueFree(pVal);
              }
              pcVar8 = pColDef->z;
              if (pcVar8 == (char *)0x0) {
                __dest = (byte *)0x0;
              }
              else {
                uVar7 = pColDef->n;
                __dest = (byte *)sqlite3DbMallocRaw(db,uVar7 + 1);
                if (__dest != (byte *)0x0) {
                  memcpy(__dest,pcVar8,(long)(int)uVar7);
                  __dest[(int)uVar7] = 0;
                }
              }
              if (__dest != (byte *)0x0) {
                iVar5 = db->flags;
                uVar7 = pColDef->n - 1;
                if (uVar7 != 0) {
                  pbVar11 = __dest + uVar7;
                  do {
                    if (((ulong)*pbVar11 != 0x3b) && ((""[*pbVar11] & 1) == 0)) break;
                    *pbVar11 = 0;
                    pbVar11 = pbVar11 + -1;
                  } while (__dest < pbVar11);
                }
                pbVar11 = (byte *)((long)&db->flags + 2);
                *pbVar11 = *pbVar11 | 0x10;
                pcVar8 = "sqlite_master";
                if (iDb == 1) {
                  pcVar8 = "sqlite_temp_master";
                }
                sqlite3NestedParse(pParse,
                                   "UPDATE \"%w\".%s SET sql = substr(sql,1,%d) || \', \' || %Q || substr(sql,%d) WHERE type = \'table\' AND name = %Q"
                                   ,pcVar10,pcVar8,(ulong)(uint)pTVar1->addColOffset,__dest,
                                   (ulong)(pTVar1->addColOffset + 1),pcVar2 + 0x10);
                sqlite3DbFree(db,__dest);
                db->flags = iVar5;
              }
              sqlite3MinimumFileFormat(pParse,iDb,3 - (uint)(pExpr == (Expr *)0x0));
              reloadTableSchema(pParse,pTab,pTab->zName);
              return;
            }
            pcVar10 = "Cannot add a NOT NULL column with default value NULL";
          }
          else {
            pcVar10 = "Cannot add a REFERENCES column with non-NULL default value";
          }
        }
        else {
          pcVar10 = "Cannot add a UNIQUE column";
        }
      }
      else {
        pcVar10 = "Cannot add a PRIMARY KEY column";
      }
      sqlite3ErrorMsg(pParse,pcVar10);
      return;
    }
  }
  return;
}

Assistant:

SQLITE_PRIVATE void sqlite3AlterFinishAddColumn(Parse *pParse, Token *pColDef){
  Table *pNew;              /* Copy of pParse->pNewTable */
  Table *pTab;              /* Table being altered */
  int iDb;                  /* Database number */
  const char *zDb;          /* Database name */
  const char *zTab;         /* Table name */
  char *zCol;               /* Null-terminated column definition */
  Column *pCol;             /* The new column */
  Expr *pDflt;              /* Default value for the new column */
  sqlite3 *db;              /* The database connection; */

  db = pParse->db;
  if( pParse->nErr || db->mallocFailed ) return;
  pNew = pParse->pNewTable;
  assert( pNew );

  assert( sqlite3BtreeHoldsAllMutexes(db) );
  iDb = sqlite3SchemaToIndex(db, pNew->pSchema);
  zDb = db->aDb[iDb].zName;
  zTab = &pNew->zName[16];  /* Skip the "sqlite_altertab_" prefix on the name */
  pCol = &pNew->aCol[pNew->nCol-1];
  pDflt = pCol->pDflt;
  pTab = sqlite3FindTable(db, zTab, zDb);
  assert( pTab );

#ifndef SQLITE_OMIT_AUTHORIZATION
  /* Invoke the authorization callback. */
  if( sqlite3AuthCheck(pParse, SQLITE_ALTER_TABLE, zDb, pTab->zName, 0) ){
    return;
  }
#endif

  /* If the default value for the new column was specified with a 
  ** literal NULL, then set pDflt to 0. This simplifies checking
  ** for an SQL NULL default below.
  */
  if( pDflt && pDflt->op==TK_NULL ){
    pDflt = 0;
  }

  /* Check that the new column is not specified as PRIMARY KEY or UNIQUE.
  ** If there is a NOT NULL constraint, then the default value for the
  ** column must not be NULL.
  */
  if( pCol->colFlags & COLFLAG_PRIMKEY ){
    sqlite3ErrorMsg(pParse, "Cannot add a PRIMARY KEY column");
    return;
  }
  if( pNew->pIndex ){
    sqlite3ErrorMsg(pParse, "Cannot add a UNIQUE column");
    return;
  }
  if( (db->flags&SQLITE_ForeignKeys) && pNew->pFKey && pDflt ){
    sqlite3ErrorMsg(pParse, 
        "Cannot add a REFERENCES column with non-NULL default value");
    return;
  }
  if( pCol->notNull && !pDflt ){
    sqlite3ErrorMsg(pParse, 
        "Cannot add a NOT NULL column with default value NULL");
    return;
  }

  /* Ensure the default expression is something that sqlite3ValueFromExpr()
  ** can handle (i.e. not CURRENT_TIME etc.)
  */
  if( pDflt ){
    sqlite3_value *pVal;
    if( sqlite3ValueFromExpr(db, pDflt, SQLITE_UTF8, SQLITE_AFF_NONE, &pVal) ){
      db->mallocFailed = 1;
      return;
    }
    if( !pVal ){
      sqlite3ErrorMsg(pParse, "Cannot add a column with non-constant default");
      return;
    }
    sqlite3ValueFree(pVal);
  }

  /* Modify the CREATE TABLE statement. */
  zCol = sqlite3DbStrNDup(db, (char*)pColDef->z, pColDef->n);
  if( zCol ){
    char *zEnd = &zCol[pColDef->n-1];
    int savedDbFlags = db->flags;
    while( zEnd>zCol && (*zEnd==';' || sqlite3Isspace(*zEnd)) ){
      *zEnd-- = '\0';
    }
    db->flags |= SQLITE_PreferBuiltin;
    sqlite3NestedParse(pParse, 
        "UPDATE \"%w\".%s SET "
          "sql = substr(sql,1,%d) || ', ' || %Q || substr(sql,%d) "
        "WHERE type = 'table' AND name = %Q", 
      zDb, SCHEMA_TABLE(iDb), pNew->addColOffset, zCol, pNew->addColOffset+1,
      zTab
    );
    sqlite3DbFree(db, zCol);
    db->flags = savedDbFlags;
  }

  /* If the default value of the new column is NULL, then set the file
  ** format to 2. If the default value of the new column is not NULL,
  ** the file format becomes 3.
  */
  sqlite3MinimumFileFormat(pParse, iDb, pDflt ? 3 : 2);

  /* Reload the schema of the modified table. */
  reloadTableSchema(pParse, pTab, pTab->zName);
}